

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double row;
  double dVar5;
  int is;
  int64_t in_stack_ffffffffffffff40;
  double dVar6;
  int64_t in_stack_ffffffffffffff48;
  TPZFMatrix<double> *in_stack_ffffffffffffff50;
  TPZFMatrix<double> *this;
  undefined4 local_1c;
  
  for (local_1c = 4; local_1c < 8; local_1c = local_1c + 1) {
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar6 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    *pdVar4 = dVar6 * dVar1;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar6 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    *pdVar4 = dVar6 * dVar1 + dVar2 * dVar5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar6 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    *pdVar4 = dVar6 * dVar1 + dVar2 * dVar5;
  }
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40)
  ;
  dVar6 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(int64_t)dVar6);
  row = dVar6 * *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff50,(int64_t)row,(int64_t)dVar6);
  *pdVar4 = row;
  pdVar4 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff50,(int64_t)row,(int64_t)dVar6);
  dVar1 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff50,(int64_t)row,(int64_t)dVar6);
  dVar2 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff50,(int64_t)row,(int64_t)dVar6);
  this = (TPZFMatrix<double> *)*pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  dVar5 = (double)this * *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  *pdVar4 = dVar1 * dVar2 + dVar5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  dVar1 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  dVar2 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  dVar5 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  dVar3 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  *pdVar4 = dVar1 * dVar2 + dVar5 * dVar3;
  for (local_1c = 4; local_1c < 8; local_1c = local_1c + 1) {
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    *pdVar4 = dVar1 + *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    *pdVar4 = dVar1 + *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    *pdVar4 = dVar1 + *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    *pdVar4 = *pdVar4 * 4.0;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    *pdVar4 = *pdVar4 * 4.0;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
    *pdVar4 = *pdVar4 * 4.0;
  }
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  *pdVar4 = *pdVar4 * 16.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  *pdVar4 = *pdVar4 * 16.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar6);
  *pdVar4 = *pdVar4 * 16.0;
  return;
}

Assistant:

void TPZShapeQuad::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		for(is=4; is<8; is++)
		{
			phi(is,0) = phi(is%4,0)*phi((is+1)%4,0);
			dphi(0,is) = dphi(0,is%4)*phi((is+1)%4,0)+phi(is%4,0)*dphi(0,(is+1)%4);
			dphi(1,is) = dphi(1,is%4)*phi((is+1)%4,0)+phi(is%4,0)*dphi(1,(is+1)%4);
		}
		phi(8,0) = phi(0,0)*phi(2,0);
		dphi(0,8) = dphi(0,0)*phi(2,0)+phi(0,0)*dphi(0,2);
		dphi(1,8) = dphi(1,0)*phi(2,0)+phi(0,0)*dphi(1,2);

		// Make the generating shape functions linear and unitary
		for(is=4; is<8; is++)
		{
			phi(is,0) += phi(8,0);
			dphi(0,is) += dphi(0,8);
			dphi(1,is) += dphi(1,8);
			phi(is,0) *= 4.;
			dphi(0,is) *= 4.;
			dphi(1,is) *= 4.;
		}
		phi(8,0) *= 16.;
		dphi(0,8) *= 16.;
		dphi(1,8) *= 16.;
	}